

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

iterator cmList::Insert(container_type *container,const_iterator pos,string *value,
                       ExpandElements expandElements,EmptyElements emptyElements)

{
  iterator iVar1;
  string tmp;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)value);
  iVar1 = Insert(container,pos,&sStack_48,expandElements,emptyElements);
  std::__cxx11::string::~string((string *)&sStack_48);
  return (iterator)iVar1._M_current;
}

Assistant:

static container_type::iterator Insert(container_type& container,
                                         container_type::const_iterator pos,
                                         const std::string& value,
                                         ExpandElements expandElements,
                                         EmptyElements emptyElements)
  {
    auto tmp = value;
    return cmList::Insert(container, pos, std::move(tmp), expandElements,
                          emptyElements);
  }